

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::MatchFinder_Construct(CMatchFinder *p)

{
  int local_1c;
  uint local_18;
  int j;
  UInt32 r;
  UInt32 i;
  CMatchFinder *p_local;
  
  p->bufferBase = (Byte *)0x0;
  p->directInput = 0;
  p->hash = (CLzRef *)0x0;
  MatchFinder_SetDefaultSettings(p);
  for (j = 0; (uint)j < 0x100; j = j + 1) {
    local_18 = j;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      local_18 = local_18 >> 1 ^ ((local_18 & 1) - 1 ^ 0xffffffff) & 0xedb88320;
    }
    p->crc[(uint)j] = local_18;
  }
  return;
}

Assistant:

void MatchFinder_Construct(CMatchFinder* p) {
  UInt32 i;
  p->bufferBase = 0;
  p->directInput = 0;
  p->hash = 0;
  MatchFinder_SetDefaultSettings(p);

  for (i = 0; i < 256; i++) {
    UInt32 r = i;
    int j;
    for (j = 0; j < 8; j++)
      r = (r >> 1) ^ (kCrcPoly & ~((r & 1) - 1));
    p->crc[i] = r;
  }
}